

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_detector.cc
# Opt level: O0

float __thiscall
webrtc::TransientDetector::ReferenceDetectionValue
          (TransientDetector *this,float *data,size_t length)

{
  double dVar1;
  ulong uStack_38;
  float result;
  size_t i;
  float reference_energy;
  size_t length_local;
  float *data_local;
  TransientDetector *this_local;
  
  if (data == (float *)0x0) {
    this->using_reference_ = false;
    this_local._4_4_ = 1.0;
  }
  else {
    i._4_4_ = 0.0;
    for (uStack_38 = 1; uStack_38 < length; uStack_38 = uStack_38 + 1) {
      i._4_4_ = data[uStack_38] * data[uStack_38] + i._4_4_;
    }
    if ((i._4_4_ != 0.0) || (NAN(i._4_4_))) {
      if ((this->reference_energy_ == 0.0) && (!NAN(this->reference_energy_))) {
        __assert_fail("reference_energy_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_detector.cc"
                      ,0xa3,
                      "float webrtc::TransientDetector::ReferenceDetectionValue(const float *, size_t)"
                     );
      }
      dVar1 = std::exp((double)(ulong)(uint)((0.2 - i._4_4_ / this->reference_energy_) * 20.0));
      this_local._4_4_ = 1.0 / (SUB84(dVar1,0) + 1.0);
      this->reference_energy_ = this->reference_energy_ * 0.99 + i._4_4_ * 0.00999999;
      this->using_reference_ = true;
    }
    else {
      this->using_reference_ = false;
      this_local._4_4_ = 1.0;
    }
  }
  return this_local._4_4_;
}

Assistant:

float TransientDetector::ReferenceDetectionValue(const float* data,
                                                 size_t length) {
  if (data == NULL) {
    using_reference_ = false;
    return 1.f;
  }
  static const float kEnergyRatioThreshold = 0.2f;
  static const float kReferenceNonLinearity = 20.f;
  static const float kMemory = 0.99f;
  float reference_energy = 0.f;
  for (size_t i = 1; i < length; ++i) {
    reference_energy += data[i] * data[i];
  }
  if (reference_energy == 0.f) {
    using_reference_ = false;
    return 1.f;
  }
  assert(reference_energy_ != 0);
  float result = 1.f / (1.f + exp(kReferenceNonLinearity *
                                  (kEnergyRatioThreshold -
                                   reference_energy / reference_energy_)));
  reference_energy_ =
      kMemory * reference_energy_ + (1.f - kMemory) * reference_energy;

  using_reference_ = true;

  return result;
}